

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall google::protobuf::Descriptor::CopyHeadingTo(Descriptor *this,DescriptorProto *proto)

{
  byte *pbVar1;
  ushort *puVar2;
  pointer pcVar3;
  FeatureSet *from;
  bool bVar4;
  void *pvVar5;
  MessageOptions *this_00;
  MessageOptions *pMVar6;
  FeatureSet *this_01;
  Arena *pAVar7;
  char *pcVar8;
  char *extraout_RDX;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ArenaStringPtr *this_02;
  string_view value;
  
  puVar2 = (ushort *)(this->all_names_).payload_;
  uVar11 = (ulong)*puVar2;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] =
       (proto->field_0)._impl_._has_bits_.has_bits_[0] | 1;
  pcVar8 = (char *)((long)puVar2 + ~uVar11);
  this_02 = &(proto->field_0)._impl_.name_;
  pAVar7 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar7 & 1) != 0) goto LAB_002113ce;
  while( true ) {
    value._M_str = pcVar8;
    value._M_len = uVar11;
    internal::ArenaStringPtr::Set(this_02,value,pAVar7);
    if (this->reserved_range_count_ < 1) break;
    this_02 = (ArenaStringPtr *)0x0;
    while( true ) {
      pvVar5 = internal::RepeatedPtrFieldBase::AddMessageLite
                         (&(proto->field_0)._impl_.reserved_range_.super_RepeatedPtrFieldBase,
                          Arena::DefaultConstruct<google::protobuf::DescriptorProto_ReservedRange>);
      uVar11 = (ulong)this->reserved_range_count_;
      if ((long)uVar11 <= (long)this_02) break;
      *(int *)((long)pvVar5 + 0x18) = this->reserved_ranges_[(long)this_02].start;
      uVar9 = *(uint *)((long)pvVar5 + 0x10);
      pAVar7 = (Arena *)(ulong)uVar9;
      *(uint *)((long)pvVar5 + 0x10) = uVar9 | 1;
      uVar11 = (ulong)this->reserved_range_count_;
      if ((long)uVar11 <= (long)this_02) goto LAB_002113c1;
      *(int *)((long)pvVar5 + 0x1c) = this->reserved_ranges_[(long)this_02].end;
      pAVar7 = (Arena *)(ulong)(uVar9 | 3);
      *(uint *)((long)pvVar5 + 0x10) = uVar9 | 3;
      this_02 = (ArenaStringPtr *)((long)&(this_02->tagged_ptr_).ptr_ + 1);
      if ((long)this->reserved_range_count_ <= (long)this_02) goto LAB_00211278;
    }
    CopyHeadingTo();
LAB_002113c1:
    CopyHeadingTo();
    pcVar8 = extraout_RDX;
LAB_002113ce:
    pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
  }
LAB_00211278:
  if (0 < this->reserved_name_count_) {
    lVar10 = 0;
    do {
      pcVar3 = (this->reserved_names_[lVar10]->_M_dataplus)._M_p;
      pvVar5 = internal::RepeatedPtrFieldBase::AddString
                         (&(proto->field_0)._impl_.reserved_name_.super_RepeatedPtrFieldBase);
      std::__cxx11::string::_M_replace((ulong)pvVar5,0,*(char **)((long)pvVar5 + 8),(ulong)pcVar3);
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->reserved_name_count_);
  }
  pMVar6 = this->options_;
  if (pMVar6 != (MessageOptions *)_MessageOptions_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
    this_00 = (proto->field_0)._impl_.options_;
    if (this_00 == (MessageOptions *)0x0) {
      pAVar7 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
      }
      this_00 = (MessageOptions *)Arena::DefaultConstruct<google::protobuf::MessageOptions>(pAVar7);
      (proto->field_0)._impl_.options_ = this_00;
    }
    MessageOptions::CopyFrom(this_00,pMVar6);
  }
  uVar9 = (byte)this->field_0x2 & 3;
  if ((this->field_0x2 & 3) != 0) {
    bVar4 = internal::ValidateEnum(uVar9,(uint32_t *)&SymbolVisibility_internal_data_);
    if (!bVar4) {
      __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::SymbolVisibility_internal_data_)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                    ,0x37e4,
                    "void google::protobuf::DescriptorProto::_internal_set_visibility(::google::protobuf::SymbolVisibility)"
                   );
    }
    (proto->field_0)._impl_.visibility_ = uVar9;
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 4;
  }
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
    pMVar6 = (proto->field_0)._impl_.options_;
    if (pMVar6 == (MessageOptions *)0x0) {
      pAVar7 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
      }
      pMVar6 = (MessageOptions *)Arena::DefaultConstruct<google::protobuf::MessageOptions>(pAVar7);
      (proto->field_0)._impl_.options_ = pMVar6;
    }
    pbVar1 = (byte *)((long)&pMVar6->field_0 + 0x18);
    *pbVar1 = *pbVar1 | 1;
    this_01 = (pMVar6->field_0)._impl_.features_;
    if (this_01 == (FeatureSet *)0x0) {
      pAVar7 = (Arena *)(pMVar6->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
      }
      this_01 = (FeatureSet *)Arena::DefaultConstruct<google::protobuf::FeatureSet>(pAVar7);
      (pMVar6->field_0)._impl_.features_ = this_01;
    }
    FeatureSet::CopyFrom(this_01,from);
    return;
  }
  return;
}

Assistant:

void Descriptor::CopyHeadingTo(DescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < reserved_range_count(); i++) {
    DescriptorProto::ReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (&options() != &MessageOptions::default_instance()) {
    *proto->mutable_options() = options();
  }

  if (visibility_keyword() != SymbolVisibility::VISIBILITY_UNSET) {
    proto->set_visibility(visibility_keyword());
  }

  RestoreFeaturesToOptions(proto_features_, proto);
}